

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

bool isPrime(BigInt *n,int k)

{
  pointer plVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  int iVar6;
  longlong *plVar7;
  BigInt d;
  BigInt local_b8;
  BigInt local_98;
  BigInt local_78;
  pair<BigInt,_long_long> local_58;
  
  bVar3 = BigInt::operator<=(n,&one);
  if (!bVar3) {
    bVar3 = BigInt::operator<=(n,&three);
    plVar1 = primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar3) {
      return true;
    }
    plVar7 = primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((*(byte *)(n->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start & 1) != 0) {
      while (plVar7 != plVar1) {
        lVar5 = BigInt::operator%(n,*plVar7);
        plVar7 = plVar7 + 1;
        if (lVar5 == 0) {
          return false;
        }
      }
      BigInt::operator-(&local_b8,n,&one);
      while ((*local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
               _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        BigInt::Half(&local_58,&local_b8);
        BigInt::operator=(&local_b8,&local_58.first);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_58);
      }
      iVar6 = 0;
      if (0 < k) {
        iVar6 = k;
      }
      iVar2 = 0;
      do {
        iVar4 = iVar2;
        if (iVar6 == iVar4) break;
        BigInt::BigInt(&local_78,&local_b8);
        BigInt::BigInt(&local_98,n);
        bVar3 = miillerTest(&local_78,&local_98);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_98);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_78);
        iVar2 = iVar4 + 1;
      } while (bVar3);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_b8);
      return k <= iVar4;
    }
  }
  return false;
}

Assistant:

bool isPrime(const BigInt &n, int k = 64) //! false negative probability 2^-128
{
    //! Corner cases
    if (n <= one) return false; //! one or less
    else if (n <= three) return true; //! 2 or 3
    else if (!(n.vector_value[0] & 1)) return false;//! even and not 2

    for (long long prime : primes)
        if (n % prime == 0) //! is prime
            return false;

    //! Find the odd number d such that d*(2^r) + 1 = n  for some r >= 1
    BigInt d = n - one;
    //!Base cases make sure that n must be odd. Since n is odd, n-1 must be even. And an even number can be written as d * 2^s where d is an odd number and s > 0
    while (!(d.vector_value[0] & 1)) //! if we found any odd number it will be put as d
        d = d.Half().first;

    // !Iterate given n repeat of 'k' times
    for (int i = 0; i < k; i++)
        if (!miillerTest(d, n))
            return false;

    return true;
}